

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  FieldDescriptor *field;
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  uint32 uVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Reflection *this;
  Reflection *this_00;
  MessageFactory *pMVar8;
  MessageFactory *pMVar9;
  MessageFactory *pMVar10;
  MapFieldBase *this_01;
  MapFieldBase *this_02;
  Message *pMVar11;
  Message *pMVar12;
  uint64 uVar13;
  EnumValueDescriptor *pEVar14;
  int64 iVar15;
  UnknownFieldSet *this_03;
  UnknownFieldSet *other;
  bool bVar16;
  float fVar17;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _func_void_FieldDescriptor_ptr *local_c0;
  FieldDescriptor *local_b8;
  MessageFactory *local_b0;
  undefined1 local_a8 [56];
  string local_70;
  string local_50;
  
  if (from == to) {
    LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x48);
    pLVar7 = LogMessage::operator<<((LogMessage *)local_a8,"CHECK failed: (&from) != (to): ");
    LogFinisher::operator=((LogFinisher *)&local_c0,pLVar7);
    LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  iVar3 = (*(from->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar4 = (*(to->super_MessageLite)._vptr_MessageLite[0x15])();
  if (CONCAT44(extraout_var_00,iVar4) != CONCAT44(extraout_var,iVar3)) {
    LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x4b);
    pLVar7 = LogMessage::operator<<
                       ((LogMessage *)local_a8,
                        "CHECK failed: (to->GetDescriptor()) == (descriptor): ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Tried to merge messages of different types ");
    pLVar7 = LogMessage::operator<<(pLVar7,"(merge ");
    pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(CONCAT44(extraout_var,iVar3) + 8));
    pLVar7 = LogMessage::operator<<(pLVar7," to ");
    iVar3 = (*(to->super_MessageLite)._vptr_MessageLite[0x15])();
    pLVar7 = LogMessage::operator<<(pLVar7,*(string **)(CONCAT44(extraout_var_01,iVar3) + 8));
    pLVar7 = LogMessage::operator<<(pLVar7,")");
    LogFinisher::operator=((LogFinisher *)&local_c0,pLVar7);
    LogMessage::~LogMessage((LogMessage *)local_a8);
  }
  this = GetReflectionOrDie(from);
  this_00 = GetReflectionOrDie(to);
  local_b0 = Reflection::GetMessageFactory(this);
  pMVar8 = MessageFactory::generated_factory();
  pMVar9 = Reflection::GetMessageFactory(this_00);
  pMVar10 = MessageFactory::generated_factory();
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  Reflection::ListFields
            (this,from,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_a8);
  if (local_a8._8_8_ != local_a8._0_8_) {
    bVar16 = local_b0 == pMVar8;
    pMVar8 = (MessageFactory *)0x0;
    do {
      field = *(pointer)(local_a8._0_8_ + pMVar8 * 8);
      local_b0 = pMVar8;
      if (*(int *)(field + 0x3c) == 3) {
        if ((pMVar9 != pMVar10) != bVar16) {
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_c0 = FieldDescriptor::TypeOnceInit;
            local_b8 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),&local_c0,&local_b8);
          }
          if ((*(int *)(field + 0x38) == 0xb) &&
             (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
            this_01 = Reflection::GetMapData(this,from,field);
            this_02 = Reflection::MutableMapData(this_00,to,field);
            bVar2 = MapFieldBase::IsMapValid(this_02);
            if ((bVar2) && (bVar2 = MapFieldBase::IsMapValid(this_01), bVar2)) {
              (*this_02->_vptr_MapFieldBase[8])(this_02,this_01);
              goto switchD_0029e7ea_default;
            }
          }
        }
        iVar3 = Reflection::FieldSize(this,from,field);
        if (0 < iVar3) {
          iVar4 = 0;
          do {
            if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
              local_c0 = FieldDescriptor::TypeOnceInit;
              local_b8 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(field + 0x30),&local_c0,&local_b8);
            }
            switch(*(undefined4 *)
                    (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
            case 1:
              iVar5 = Reflection::GetRepeatedInt32(this,from,field,iVar4);
              Reflection::AddInt32(this_00,to,field,iVar5);
              break;
            case 2:
              iVar15 = Reflection::GetRepeatedInt64(this,from,field,iVar4);
              Reflection::AddInt64(this_00,to,field,iVar15);
              break;
            case 3:
              uVar6 = Reflection::GetRepeatedUInt32(this,from,field,iVar4);
              Reflection::AddUInt32(this_00,to,field,uVar6);
              break;
            case 4:
              uVar13 = Reflection::GetRepeatedUInt64(this,from,field,iVar4);
              Reflection::AddUInt64(this_00,to,field,uVar13);
              break;
            case 5:
              dVar1 = Reflection::GetRepeatedDouble(this,from,field,iVar4);
              Reflection::AddDouble(this_00,to,field,dVar1);
              break;
            case 6:
              fVar17 = Reflection::GetRepeatedFloat(this,from,field,iVar4);
              Reflection::AddFloat(this_00,to,field,fVar17);
              break;
            case 7:
              bVar2 = Reflection::GetRepeatedBool(this,from,field,iVar4);
              Reflection::AddBool(this_00,to,field,bVar2);
              break;
            case 8:
              pEVar14 = Reflection::GetRepeatedEnum(this,from,field,iVar4);
              Reflection::AddEnum(this_00,to,field,pEVar14);
              break;
            case 9:
              Reflection::GetRepeatedString_abi_cxx11_(&local_50,this,from,field,iVar4);
              Reflection::AddString(this_00,to,field,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              break;
            case 10:
              pMVar11 = Reflection::AddMessage(this_00,to,field,(MessageFactory *)0x0);
              pMVar12 = Reflection::GetRepeatedMessage(this,from,field,iVar4);
              (*(pMVar11->super_MessageLite)._vptr_MessageLite[0x11])(pMVar11,pMVar12);
            }
            iVar4 = iVar4 + 1;
          } while (iVar3 != iVar4);
        }
      }
      else {
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_c0 = FieldDescriptor::TypeOnceInit;
          local_b8 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),&local_c0,&local_b8);
        }
        switch(*(undefined4 *)
                (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
        case 1:
          iVar5 = Reflection::GetInt32(this,from,field);
          Reflection::SetInt32(this_00,to,field,iVar5);
          break;
        case 2:
          iVar15 = Reflection::GetInt64(this,from,field);
          Reflection::SetInt64(this_00,to,field,iVar15);
          break;
        case 3:
          uVar6 = Reflection::GetUInt32(this,from,field);
          Reflection::SetUInt32(this_00,to,field,uVar6);
          break;
        case 4:
          uVar13 = Reflection::GetUInt64(this,from,field);
          Reflection::SetUInt64(this_00,to,field,uVar13);
          break;
        case 5:
          dVar1 = Reflection::GetDouble(this,from,field);
          Reflection::SetDouble(this_00,to,field,dVar1);
          break;
        case 6:
          fVar17 = Reflection::GetFloat(this,from,field);
          Reflection::SetFloat(this_00,to,field,fVar17);
          break;
        case 7:
          bVar2 = Reflection::GetBool(this,from,field);
          Reflection::SetBool(this_00,to,field,bVar2);
          break;
        case 8:
          pEVar14 = Reflection::GetEnum(this,from,field);
          Reflection::SetEnum(this_00,to,field,pEVar14);
          break;
        case 9:
          Reflection::GetString_abi_cxx11_(&local_70,this,from,field);
          Reflection::SetString(this_00,to,field,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          break;
        case 10:
          pMVar11 = Reflection::MutableMessage(this_00,to,field,(MessageFactory *)0x0);
          pMVar12 = Reflection::GetMessage(this,from,field,(MessageFactory *)0x0);
          (*(pMVar11->super_MessageLite)._vptr_MessageLite[0x11])(pMVar11,pMVar12);
        }
      }
switchD_0029e7ea_default:
      pMVar8 = (MessageFactory *)((long)&local_b0->_vptr_MessageFactory + 1);
    } while (pMVar8 < (MessageFactory *)((long)(local_a8._8_8_ - local_a8._0_8_) >> 3));
  }
  this_03 = Reflection::MutableUnknownFields(this_00,to);
  other = Reflection::GetUnknownFields(this,from);
  UnknownFieldSet::MergeFrom(this_03,other);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  return;
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  GOOGLE_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  GOOGLE_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            to_reflection->AddMessage(to, field)->MergeFrom(
                from_reflection->GetRepeatedMessage(from, field, j));
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          to_reflection->MutableMessage(to, field)->MergeFrom(
              from_reflection->GetMessage(from, field));
          break;
      }
    }
  }

  to_reflection->MutableUnknownFields(to)->MergeFrom(
      from_reflection->GetUnknownFields(from));
}